

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_cast.c
# Opt level: O0

int l2_cast_hex_str_to_int(char *s)

{
  size_t sVar1;
  int local_30;
  int local_2c;
  int ans_1;
  int i;
  int factor;
  int digit;
  int n;
  int ans;
  char *p;
  char *s_local;
  
  l2_assert_func((long)s,L2_INTERNAL_ERROR_NULL_POINTER,"l2_cast_hex_str_to_int",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/AloneCafe[P]l2/l2_parser/l2_cast.c"
                 ,0xb);
  digit = 0;
  sVar1 = strlen(s);
  factor = (int)sVar1;
  i = 0;
  for (_n = s; *_n != '\0'; _n = _n + 1) {
    local_30 = 1;
    for (local_2c = 0; local_2c < factor + -1; local_2c = local_2c + 1) {
      local_30 = local_30 << 3;
    }
    if ((*_n < '0') || ('9' < *_n)) {
      if ((*_n < 'a') || ('f' < *_n)) {
        if (('@' < *_n) && (*_n < 'G')) {
          i = *_n + -0x37;
        }
      }
      else {
        i = *_n + -0x57;
      }
    }
    else {
      i = *_n + -0x30;
    }
    digit = local_30 * i + digit;
    factor = factor + -1;
  }
  return digit;
}

Assistant:

int l2_cast_hex_str_to_int(const char *s) {
    l2_assert(s, L2_INTERNAL_ERROR_NULL_POINTER);
    const char *p;
    int ans = 0, n = strlen(s), digit = 0, factor;
    for (p = s; *p != '\0'; p++) {
        l2_pow(factor, 8, n - 1);
        if (*p >= '0' && *p <= '9') {
            digit = *p - '0';
        } else if (*p >= 'a' && *p <= 'f') {
            digit = *p - 'a' + 10;
        } else if (*p >= 'A' && *p <= 'F') {
            digit = *p - 'A' + 10;
        }
        ans += factor * digit;
        n -= 1;
    }
    return ans;
}